

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::Image::~Image(Image *this)

{
  Image *this_local;
  
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__Image_00144990;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->data);
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)&this->name);
  Item::~Item(&this->super_Item);
  return;
}

Assistant:

~Image		(void) {}